

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  bool bVar1;
  ulong uVar2;
  NamePattern *this_00;
  ExcludedPattern *this_01;
  Ptr<Catch::TestSpec::Pattern> local_90;
  Ptr<Catch::TestSpec::Pattern> pattern;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string token;
  TestSpecParser *this_local;
  
  token.field_2._8_8_ = this;
  subString_abi_cxx11_((string *)local_30,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"exclude:",&local_51);
  bVar1 = startsWith((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (bVar1) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&pattern,(ulong)local_30);
    std::__cxx11::string::operator=((string *)local_30,(string *)&pattern);
    std::__cxx11::string::~string((string *)&pattern);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = (NamePattern *)operator_new(0x38);
    TestSpec::NamePattern::NamePattern(this_00,(string *)local_30);
    Ptr<Catch::TestSpec::Pattern>::Ptr(&local_90,(Pattern *)this_00);
    if ((this->m_exclusion & 1U) != 0) {
      this_01 = (ExcludedPattern *)operator_new(0x18);
      TestSpec::ExcludedPattern::ExcludedPattern(this_01,&local_90);
      Ptr<Catch::TestSpec::Pattern>::operator=(&local_90,(Pattern *)this_01);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&local_90);
    Ptr<Catch::TestSpec::Pattern>::~Ptr(&local_90);
  }
  this->m_exclusion = false;
  this->m_mode = None;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }